

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O0

Time __thiscall helics::FederateInfo::checkTimeProperty(FederateInfo *this,int propId,Time defVal)

{
  bool bVar1;
  baseType in_RDX;
  int in_ESI;
  pair<int,_TimeRepresentation<count_time<9,_long>_>_> *prop;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
  *__range1;
  vector<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
  *in_stack_ffffffffffffffb8;
  reference in_stack_ffffffffffffffc0;
  __normal_iterator<const_std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_*,_std::vector<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>_>
  local_30 [2];
  int local_1c;
  baseType local_10;
  
  local_1c = in_ESI;
  local_10 = in_RDX;
  local_30[0]._M_current =
       (pair<int,_TimeRepresentation<count_time<9,_long>_>_> *)
       CLI::std::
       vector<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
       ::begin(in_stack_ffffffffffffffb8);
  CLI::std::
  vector<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
  ::end(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_*,_std::vector<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>_>
                      ((__normal_iterator<const_std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_*,_std::vector<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>_>
                        *)in_stack_ffffffffffffffc0,
                       (__normal_iterator<const_std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_*,_std::vector<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return (Time)local_10;
    }
    in_stack_ffffffffffffffc0 =
         __gnu_cxx::
         __normal_iterator<const_std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_*,_std::vector<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>_>
         ::operator*(local_30);
    if (in_stack_ffffffffffffffc0->first == local_1c) break;
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_*,_std::vector<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>_>
    ::operator++(local_30);
  }
  return (Time)(in_stack_ffffffffffffffc0->second).internalTimeCode;
}

Assistant:

Time FederateInfo::checkTimeProperty(int propId, Time defVal) const
{
    for (const auto& prop : timeProps) {
        if (prop.first == propId) {
            return prop.second;
        }
    }
    return defVal;
}